

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O0

function<cs::token_base_*()> * __thiscall
cs::
mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>
::match(mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>
        *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  bool bVar1;
  compile_error *this_00;
  mapped_type *pmVar2;
  string *in_stack_ffffffffffffff98;
  mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>
  *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>_>_>
  *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [48];
  
  bVar1 = exist(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (!bVar1) {
    this_00 = (compile_error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Undefined Mapping.",&local_31);
    compile_error::compile_error(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>_>_>
           ::at(in_stack_ffffffffffffffc0,
                (key_type *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  return pmVar2;
}

Assistant:

const T &match(const Key &k) const
		{
			if (!exist(k))
				throw compile_error("Undefined Mapping.");
			return mDat.at(k);
		}